

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O2

void __thiscall
QSequentialAnimationGroupPrivate::animationRemoved
          (QSequentialAnimationGroupPrivate *this,qsizetype index,QAbstractAnimation *anim)

{
  QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
  *this_00;
  QObject *pQVar1;
  int iVar2;
  parameter_type pVar3;
  parameter_type pVar4;
  int iVar5;
  parameter_type pQVar6;
  qsizetype qVar7;
  qsizetype i;
  long lVar8;
  
  pQVar1 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.super_QObjectPrivate
           .super_QObjectData.q_ptr;
  QAnimationGroupPrivate::animationRemoved(&this->super_QAnimationGroupPrivate,index,anim);
  this_00 = &this->currentAnimation;
  pQVar6 = QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
           ::value(this_00);
  if (pQVar6 == (parameter_type)0x0) {
    return;
  }
  if (index < (this->actualDuration).d.size) {
    QList<int>::removeAt(&this->actualDuration,index);
  }
  qVar7 = QtPrivate::
          indexOf<QAbstractAnimation_*,_QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>_>
                    (&(this->super_QAnimationGroupPrivate).animations,this_00,0);
  if (qVar7 != -1) {
    if (index < this->currentAnimationIndex) {
      this->currentAnimationIndex = this->currentAnimationIndex + -1;
    }
    goto LAB_0036c660;
  }
  pQVar6 = QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
           ::value(this_00);
  QAnimationGroupPrivate::disconnectUncontrolledAnimation
            (&this->super_QAnimationGroupPrivate,pQVar6);
  if (index < (this->super_QAnimationGroupPrivate).animations.d.size) {
LAB_0036c653:
    iVar2 = (int)index;
  }
  else {
    if (index != 0) {
      index = (qsizetype)((int)index - 1);
      goto LAB_0036c653;
    }
    iVar2 = -1;
  }
  setCurrentAnimation(this,iVar2,false);
LAB_0036c660:
  (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime = 0;
  iVar2 = 0;
  for (lVar8 = 0; lVar8 < this->currentAnimationIndex; lVar8 = lVar8 + 1) {
    iVar2 = animationActualTotalDuration(this,(int)lVar8);
    iVar2 = iVar2 + (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime
    ;
    (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime = iVar2;
  }
  if (qVar7 != -1) {
    pQVar6 = QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
             ::value(this_00);
    pVar3 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
            ::value((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
                     *)&(pQVar6->super_QObject).d_ptr.d[1].field_0x30);
    iVar2 = pVar3 + (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime
    ;
    (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime = iVar2;
  }
  pVar4 = QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
          ::value(&(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.loopCount);
  iVar5 = (*pQVar1->_vptr_QObject[0xc])(pQVar1);
  QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
  ::setValue(&(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.totalCurrentTime,
             pVar4 * iVar5 + iVar2);
  return;
}

Assistant:

void QSequentialAnimationGroupPrivate::animationRemoved(qsizetype index, QAbstractAnimation *anim)
{
    Q_Q(QSequentialAnimationGroup);
    QAnimationGroupPrivate::animationRemoved(index, anim);

    if (!currentAnimation)
        return;

    if (actualDuration.size() > index)
        actualDuration.removeAt(index);

    const qsizetype currentIndex = animations.indexOf(currentAnimation);
    if (currentIndex == -1) {
        //we're removing the current animation

        disconnectUncontrolledAnimation(currentAnimation);

        if (index < animations.size())
            setCurrentAnimation(index); //let's try to take the next one
        else if (index > 0)
            setCurrentAnimation(index - 1);
        else// case all animations were removed
            setCurrentAnimation(-1);
    } else if (currentAnimationIndex > index) {
        currentAnimationIndex--;
    }

    // duration of the previous animations up to the current animation
    currentTime = 0;
    for (qsizetype i = 0; i < currentAnimationIndex; ++i) {
        const int current = animationActualTotalDuration(i);
        currentTime += current;
    }

    if (currentIndex != -1) {
        //the current animation is not the one being removed
        //so we add its current time to the current time of this group
        currentTime += QAbstractAnimationPrivate::get(currentAnimation)->totalCurrentTime;
    }

    //let's also update the total current time
    totalCurrentTime = currentTime + loopCount * q->duration();
}